

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NodeIterator.cpp
# Opt level: O0

NodeIterator * __thiscall NodeIterator::operator++(NodeIterator *this)

{
  bool bVar1;
  NodeIterator *in_RDI;
  set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_> *in_stack_ffffffffffffffc8;
  iterator *this_00;
  iterator *in_stack_ffffffffffffffd0;
  _Self local_20;
  _Self local_18 [3];
  
  if (in_RDI->forkNode == (ForkNode *)0x0) {
    if (in_RDI->exitNode != (ExitNode *)0x0) {
      this_00 = &in_RDI->joinSuccessorsIterator;
      ExitNode::joinSuccessors(in_RDI->exitNode);
      local_20._M_node =
           (_Base_ptr)
           std::set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_>::end
                     ((set<JoinNode_*,_std::less<JoinNode_*>,_std::allocator<JoinNode_*>_> *)this_00
                     );
      bVar1 = std::operator!=(this_00,&local_20);
      if (bVar1) {
        std::_Rb_tree_const_iterator<JoinNode_*>::operator++
                  ((_Rb_tree_const_iterator<JoinNode_*> *)in_stack_ffffffffffffffd0);
        return in_RDI;
      }
    }
  }
  else {
    in_stack_ffffffffffffffd0 = &in_RDI->forkSuccessorsIterator;
    ForkNode::forkSuccessors(in_RDI->forkNode);
    local_18[0]._M_node =
         (_Base_ptr)
         std::set<EntryNode_*,_std::less<EntryNode_*>,_std::allocator<EntryNode_*>_>::end
                   (in_stack_ffffffffffffffc8);
    bVar1 = std::operator!=(in_stack_ffffffffffffffd0,local_18);
    if (bVar1) {
      std::_Rb_tree_const_iterator<EntryNode_*>::operator++(in_stack_ffffffffffffffd0);
      return in_RDI;
    }
  }
  std::_Rb_tree_const_iterator<Node_*>::operator++
            ((_Rb_tree_const_iterator<Node_*> *)in_stack_ffffffffffffffd0);
  return in_RDI;
}

Assistant:

NodeIterator &NodeIterator::operator++() {
    if (forkNode) {
        if (forkSuccessorsIterator != forkNode->forkSuccessors().end()) {
            ++forkSuccessorsIterator;
            return *this;
        }
    } else if (exitNode) {
        if (joinSuccessorsIterator != exitNode->joinSuccessors().end()) {
            ++joinSuccessorsIterator;
            return *this;
        }
    }
    ++successorsIterator;
    return *this;
}